

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O0

void __thiscall CItems::OnRender(CItems *this)

{
  int iVar1;
  int iVar2;
  IClient *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CNetObj_GameDataFlag *pPrevGameDataFlag_00;
  CNetObj_GameDataFlag *pCurGameDataFlag;
  CItems *in_RDI;
  long in_FS_OFFSET;
  void *pPrevGameDataFlag;
  void *pPrev_1;
  void *pData_1;
  CNetObj_Projectile *in_stack_00000020;
  int i_1;
  void *pPrev;
  void *pData;
  int i;
  int Num;
  CSnapItem Item_1;
  CSnapItem Item;
  undefined4 in_stack_ffffffffffffffb8;
  CNetObj_Flag *in_stack_ffffffffffffffc0;
  CNetObj_Pickup *in_stack_ffffffffffffffc8;
  uint uVar4;
  CItems *this_00;
  uint local_20;
  uint local_1c;
  uint local_14;
  uint local_10;
  long local_8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pIVar3 = CComponent::Client((CComponent *)0x16e199);
  iVar1 = IClient::State(pIVar3);
  if (2 < iVar1) {
    pIVar3 = CComponent::Client((CComponent *)0x16e1b4);
    iVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x1e])(pIVar3,0);
    for (uVar4 = 0; (int)uVar4 < iVar1; uVar4 = uVar4 + 1) {
      pIVar3 = CComponent::Client((CComponent *)0x16e1e5);
      iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,0,(ulong)uVar4,&local_14);
      in_stack_ffffffffffffffc8 = (CNetObj_Pickup *)CONCAT44(extraout_var,iVar2);
      if (local_14 == 2) {
        RenderProjectile((CItems *)pPrev,in_stack_00000020,pData_1._4_4_);
      }
      else if (local_14 == 4) {
        pIVar3 = CComponent::Client((CComponent *)0x16e22c);
        iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x1f])
                          (pIVar3,1,(ulong)local_14,(ulong)local_10);
        in_stack_ffffffffffffffc0 = (CNetObj_Flag *)CONCAT44(extraout_var_00,iVar2);
        if (in_stack_ffffffffffffffc0 != (CNetObj_Flag *)0x0) {
          RenderPickup(this_00,(CNetObj_Pickup *)CONCAT44(iVar1,uVar4),in_stack_ffffffffffffffc8);
        }
      }
      else if (local_14 == 3) {
        RenderLaser((CItems *)Item._4_8_,stack0x00000050);
      }
    }
    for (uVar4 = 0; (int)uVar4 < iVar1; uVar4 = uVar4 + 1) {
      pIVar3 = CComponent::Client((CComponent *)0x16e2b1);
      iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,0,(ulong)uVar4,&local_20);
      pPrevGameDataFlag_00 = (CNetObj_GameDataFlag *)CONCAT44(extraout_var_01,iVar2);
      if (local_20 == 5) {
        pIVar3 = CComponent::Client((CComponent *)0x16e2e1);
        iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x1f])
                          (pIVar3,1,(ulong)local_20,(ulong)local_1c);
        pCurGameDataFlag = (CNetObj_GameDataFlag *)CONCAT44(extraout_var_02,iVar2);
        if (pCurGameDataFlag != (CNetObj_GameDataFlag *)0x0) {
          pIVar3 = CComponent::Client((CComponent *)0x16e310);
          (*(pIVar3->super_IInterface)._vptr_IInterface[0x1f])
                    (pIVar3,1,8,
                     (ulong)(uint)(((in_RDI->super_CComponent).m_pClient)->m_Snap).
                                  m_GameDataFlagSnapID);
          RenderFlag((CItems *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (CNetObj_Flag *)CONCAT44(uVar4,in_stack_ffffffffffffffb8),pPrevGameDataFlag_00,
                     pCurGameDataFlag);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
		return;

	int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
	for(int i = 0; i < Num; i++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

		if(Item.m_Type == NETOBJTYPE_PROJECTILE)
		{
			RenderProjectile((const CNetObj_Projectile *)pData, Item.m_ID);
		}
		else if(Item.m_Type == NETOBJTYPE_PICKUP)
		{
			const void *pPrev = Client()->SnapFindItem(IClient::SNAP_PREV, Item.m_Type, Item.m_ID);
			if(pPrev)
				RenderPickup((const CNetObj_Pickup *)pPrev, (const CNetObj_Pickup *)pData);
		}
		else if(Item.m_Type == NETOBJTYPE_LASER)
		{
			RenderLaser((const CNetObj_Laser *)pData);
		}
	}

	// render flag
	for(int i = 0; i < Num; i++)
	{
		IClient::CSnapItem Item;
		const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

		if(Item.m_Type == NETOBJTYPE_FLAG)
		{
			const void *pPrev = Client()->SnapFindItem(IClient::SNAP_PREV, Item.m_Type, Item.m_ID);
			if(pPrev)
			{
				const void *pPrevGameDataFlag = Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_GAMEDATAFLAG, m_pClient->m_Snap.m_GameDataFlagSnapID);
				RenderFlag(static_cast<const CNetObj_Flag *>(pPrev), static_cast<const CNetObj_Flag *>(pData),
							static_cast<const CNetObj_GameDataFlag *>(pPrevGameDataFlag), m_pClient->m_Snap.m_pGameDataFlag);
			}
		}
	}
}